

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindEquiWidthFunction
          (duckdb *this,ClientContext *param_1,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  reference pvVar4;
  pointer pEVar5;
  undefined2 local_50 [4];
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_48;
  undefined2 local_38;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_28;
  
  duckdb::LogicalType::LogicalType((LogicalType *)local_50);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  if (1 < (byte)pEVar5[0x38] - 1) {
    if (pEVar5[0x38] == (Expression)0x15) {
      duckdb::LogicalType::LogicalType((LogicalType *)&local_38,DOUBLE);
      _Var3._M_pi = local_48.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar1 = local_48.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50[0] = local_38;
      local_48.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_30;
      local_48.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Stack_28;
      local_30 = peVar1;
      p_Stack_28 = _Var3._M_pi;
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_38);
    }
    else {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      if ((LogicalType *)local_50 != (LogicalType *)(pEVar5 + 0x38)) {
        local_50[0] = *(undefined2 *)(pEVar5 + 0x38);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&local_48,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar5 + 0x40));
      }
    }
    duckdb::LogicalType::LIST((LogicalType *)&local_38);
    bound_function->field_0x90 = local_38._0_1_;
    bound_function->field_0x91 = local_38._1_1_;
    peVar1 = *(element_type **)&bound_function->field_0x98;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
    *(element_type **)&bound_function->field_0x98 = local_30;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0 = p_Stack_28;
    local_30 = peVar1;
    p_Stack_28 = p_Var2;
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_38);
  }
  *(undefined8 *)this = 0;
  duckdb::LogicalType::~LogicalType((LogicalType *)local_50);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindEquiWidthFunction(ClientContext &, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	// while internally the bins are computed over a unified type
	// the equi_width_bins function returns the same type as the input MAX
	LogicalType child_type;
	switch (arguments[1]->return_type.id()) {
	case LogicalTypeId::UNKNOWN:
	case LogicalTypeId::SQLNULL:
		return nullptr;
	case LogicalTypeId::DECIMAL:
		// for decimals we promote to double because
		child_type = LogicalType::DOUBLE;
		break;
	default:
		child_type = arguments[1]->return_type;
		break;
	}
	bound_function.return_type = LogicalType::LIST(child_type);
	return nullptr;
}